

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_ffh_string_sub(lua_State *L)

{
  TValue *pTVar1;
  int32_t iVar2;
  lua_State *in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lj_lib_checkstr((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDI >> 0x20));
  lj_lib_checkint(in_RDI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pTVar1 = in_RDI->base;
  iVar2 = lj_lib_optint((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        (int)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  pTVar1[2].n = (double)iVar2;
  return 0;
}

Assistant:

LJLIB_ASM(string_sub)		LJLIB_REC(string_range 1)
{
  lj_lib_checkstr(L, 1);
  lj_lib_checkint(L, 2);
  setintV(L->base+2, lj_lib_optint(L, 3, -1));
  return FFH_RETRY;
}